

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O0

timestamp_t __thiscall
duckdb::QuantileSortTree::WindowScalar<duckdb::timestamp_t,duckdb::timestamp_t,false>
          (QuantileSortTree *this,QuantileCursor<duckdb::timestamp_t> *data,SubFrames *frames,
          idx_t n,Vector *result,QuantileValue *q)

{
  QuantileSortTree *frames_00;
  timestamp_t tVar1;
  CURSOR *in_RSI;
  undefined8 in_RDI;
  Interpolator<false> *in_R9;
  ID indirect;
  idx_t hi_data;
  idx_t lo_data;
  Interpolator<false> interp;
  QuantileIndirect<duckdb::timestamp_t> in_stack_ffffffffffffff80;
  QuantileValue *in_stack_ffffffffffffff88;
  Interpolator<false> *in_stack_ffffffffffffff90;
  Vector *in_stack_ffffffffffffffa8;
  Vector *in_stack_ffffffffffffffb0;
  unsigned_long in_stack_ffffffffffffffb8;
  unsigned_long in_stack_ffffffffffffffc0;
  
  unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>,_true>::
  operator->((unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>,_true>
              *)in_stack_ffffffffffffff80.data);
  WindowMergeSortTree::Build((WindowMergeSortTree *)in_stack_ffffffffffffff80.data);
  Interpolator<false>::Interpolator
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
             (idx_t)in_stack_ffffffffffffff80.data,SUB81((ulong)in_RDI >> 0x38,0));
  frames_00 = (QuantileSortTree *)
              SelectNth((QuantileSortTree *)in_stack_ffffffffffffff90,
                        (SubFrames *)in_stack_ffffffffffffff88,
                        (size_t)in_stack_ffffffffffffff80.data);
  if (in_stack_ffffffffffffffb0 != in_stack_ffffffffffffffa8) {
    SelectNth(frames_00,(SubFrames *)frames_00,(size_t)in_stack_ffffffffffffff80.data);
  }
  QuantileIndirect<duckdb::timestamp_t>::QuantileIndirect
            ((QuantileIndirect<duckdb::timestamp_t> *)&stack0xffffffffffffff80,in_RSI);
  tVar1 = Interpolator<false>::
          Interpolate<unsigned_long,duckdb::timestamp_t,duckdb::QuantileIndirect<duckdb::timestamp_t>>
                    (in_R9,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                     in_stack_ffffffffffffffb0,
                     (QuantileIndirect<duckdb::timestamp_t> *)in_stack_ffffffffffffffa8);
  return (timestamp_t)tVar1.value;
}

Assistant:

RESULT_TYPE WindowScalar(QuantileCursor<INPUT_TYPE> &data, const SubFrames &frames, const idx_t n, Vector &result,
	                         const QuantileValue &q) {
		D_ASSERT(n > 0);

		//	Thread safe and idempotent.
		index_tree->Build();

		//	Find the interpolated indicies within the frame
		Interpolator<DISCRETE> interp(q, n, false);
		const auto lo_data = SelectNth(frames, interp.FRN);
		auto hi_data = lo_data;
		if (interp.CRN != interp.FRN) {
			hi_data = SelectNth(frames, interp.CRN);
		}

		//	Interpolate indirectly
		using ID = QuantileIndirect<INPUT_TYPE>;
		ID indirect(data);
		return interp.template Interpolate<idx_t, RESULT_TYPE, ID>(lo_data, hi_data, result, indirect);
	}